

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O0

FT_UInt32 * tt_cmap14_get_nondef_chars(TT_CMap cmap,FT_Byte *p,FT_Memory memory)

{
  uint uVar1;
  FT_Error FVar2;
  FT_UInt32 *ret;
  FT_UInt i;
  FT_UInt32 numMappings;
  TT_CMap14 cmap14;
  FT_Memory memory_local;
  FT_Byte *p_local;
  TT_CMap cmap_local;
  
  memory_local = (FT_Memory)(p + 4);
  uVar1 = (uint)*p << 0x18 | (uint)p[1] << 0x10 | (uint)p[2] << 8 | (uint)p[3];
  FVar2 = tt_cmap14_ensure((TT_CMap14)cmap,uVar1 + 1,memory);
  if (FVar2 == 0) {
    cmap_local = (TT_CMap)cmap[1].cmap.clazz;
    for (ret._0_4_ = 0; (uint)ret < uVar1; ret._0_4_ = (uint)ret + 1) {
      *(uint *)((long)&((FT_CMap_Class)cmap_local)->size + (ulong)(uint)ret * 4) =
           (uint)*(byte *)&memory_local->user << 0x10 |
           (uint)*(byte *)((long)&memory_local->user + 1) << 8 |
           (uint)*(byte *)((long)&memory_local->user + 2);
      memory_local = (FT_Memory)((long)&memory_local->user + 5);
    }
    *(undefined4 *)((long)&((FT_CMap_Class)cmap_local)->size + (ulong)(uint)ret * 4) = 0;
  }
  else {
    cmap_local = (TT_CMap)0x0;
  }
  return (FT_UInt32 *)cmap_local;
}

Assistant:

static FT_UInt32*
  tt_cmap14_get_nondef_chars( TT_CMap     cmap,
                              FT_Byte    *p,
                              FT_Memory   memory )
  {
    TT_CMap14   cmap14 = (TT_CMap14) cmap;
    FT_UInt32   numMappings;
    FT_UInt     i;
    FT_UInt32  *ret;


    numMappings = (FT_UInt32)TT_NEXT_ULONG( p );

    if ( tt_cmap14_ensure( cmap14, ( numMappings + 1 ), memory ) )
      return NULL;

    ret = cmap14->results;
    for ( i = 0; i < numMappings; i++ )
    {
      ret[i] = (FT_UInt32)TT_NEXT_UINT24( p );
      p += 2;
    }
    ret[i] = 0;

    return ret;
  }